

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-sha512.c
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  uint8_t *__s2;
  uint8_t checkhash [64];
  sha512 h;
  uint8_t auStack_138 [72];
  sha512 local_f0;
  
  __s2 = table[0].hash;
  lVar2 = 0;
  do {
    sha512_init(&local_f0);
    sha512_add(&local_f0,__s2 + -0x4000,
               (long)((anon_struct_16452_3_6bb04327 *)(__s2 + -0x4004))->len);
    sha512_final(&local_f0,auStack_138);
    iVar1 = bcmp(auStack_138,__s2,0x40);
    if (iVar1 != 0) {
      main_cold_1();
      return 1;
    }
    lVar2 = lVar2 + 1;
    __s2 = __s2 + 0x4044;
  } while (lVar2 != 0x80);
  return 0;
}

Assistant:

int main()
{
	struct sha512 h;
	uint8_t checkhash[SHA512_HASH_LENGTH];
	int i;

	for (i = 0; i < table_num; i++) {
		sha512_init(&h);
		sha512_add(&h, table[i].buffer, table[i].len);
		sha512_final(&h, checkhash);

		if (memcmp(checkhash, table[i].hash, SHA512_HASH_LENGTH) != 0) {
			fprintf(stderr, "sha512-selftest: can't verify hash number %d\n", i+1);
			return 1;
		}
	}

	return 0;
}